

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

int32_t google_protobuf_FieldDescriptorProto_type(google_protobuf_FieldDescriptorProto *msg)

{
  _Bool _Var1;
  undefined4 in_EAX;
  int32_t ret;
  int32_t default_val;
  
  _ret = CONCAT44(1,in_EAX);
  _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_0036865c,&default_val);
  if ((!_Var1) &&
     (_Var1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)&DAT_0036865c), !_Var1)) {
    return 1;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)&DAT_0036865c,&ret,
             (void *)((long)&msg[2].base_dont_copy_me__upb_internal_use_only.field_0 + 4));
  return ret;
}

Assistant:

UPB_INLINE int32_t google_protobuf_FieldDescriptorProto_type(const google_protobuf_FieldDescriptorProto* msg) {
  int32_t default_val = 1;
  int32_t ret;
  const upb_MiniTableField field = {5, 20, 68, 2, 14, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}